

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

void __thiscall
btMatrixX<float>::multiply2_p8r
          (btMatrixX<float> *this,btScalar *B,btScalar *C,int numRows,int numRowsOther,int row,
          int col)

{
  int iVar1;
  ulong uVar2;
  float *pfVar3;
  int iVar4;
  long lVar5;
  
  if (0 < numRows) {
    iVar1 = this->m_cols;
    iVar4 = this->m_setElemOperations;
    pfVar3 = (this->m_storage).m_data + (long)row * (long)iVar1 + (long)col;
    uVar2 = 0;
    do {
      if (0 < numRowsOther) {
        lVar5 = 0;
        do {
          *(float *)((long)pfVar3 + lVar5) =
               B[6] * C[lVar5 * 2 + 6] +
               B[5] * C[lVar5 * 2 + 5] +
               B[4] * C[lVar5 * 2 + 4] +
               B[2] * C[lVar5 * 2 + 2] + B[1] * C[lVar5 * 2 + 1] + *B * C[lVar5 * 2];
          lVar5 = lVar5 + 4;
        } while ((ulong)(uint)numRowsOther << 2 != lVar5);
        iVar4 = iVar4 + numRowsOther;
        this->m_setElemOperations = iVar4;
      }
      B = B + 8;
      uVar2 = uVar2 + 1;
      pfVar3 = pfVar3 + iVar1;
    } while (uVar2 != (uint)numRows);
  }
  return;
}

Assistant:

void multiply2_p8r (const btScalar *B, const btScalar *C,  int numRows,  int numRowsOther, int row, int col)
	{
		btAssert (numRows>0 && numRowsOther>0 && B && C);
		const btScalar *bb = B;
		for ( int i = 0;i<numRows;i++)
		{
			const btScalar *cc = C;
			for ( int j = 0;j<numRowsOther;j++)
			{
				btScalar sum;
				sum  = bb[0]*cc[0];
				sum += bb[1]*cc[1];
				sum += bb[2]*cc[2];
				sum += bb[4]*cc[4];
				sum += bb[5]*cc[5];
				sum += bb[6]*cc[6];
				setElem(row+i,col+j,sum);
				cc += 8;
			}
			bb += 8;
		}
	}